

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O0

_Bool player_has_temporary_slay(player *p,wchar_t idx)

{
  int local_20;
  wchar_t i;
  wchar_t idx_local;
  player *p_local;
  
  local_20 = 0;
  while( true ) {
    if (0x34 < local_20) {
      return false;
    }
    if ((timed_effects[local_20].temp_slay == idx) && (p->timed[local_20] != 0)) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool player_has_temporary_slay(const struct player *p, int idx)
{
	int i = 0;

	while (i < TMD_MAX) {
		if (timed_effects[i].temp_slay == idx && p->timed[i]) {
			return true;
		}
		++i;
	}
	return false;
}